

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::ReadID(SQLexer *this)

{
  int iVar1;
  char *pcVar2;
  SQUnsignedInteger SVar3;
  bool bVar4;
  char local_1b;
  LexChar local_1a [2];
  SQInteger local_18;
  SQInteger res;
  SQLexer *this_local;
  
  local_1a[1] = 0;
  res = (SQInteger)this;
  sqvector<char>::resize(&this->_longstr,0,(char *)(local_1a + 1));
  do {
    local_1a[0] = this->_currdata;
    sqvector<char>::push_back(&this->_longstr,(char *)local_1a);
    Next(this);
    this->_currentcolumn = this->_currentcolumn + 1;
    iVar1 = isalnum((uint)this->_currdata);
    bVar4 = true;
    if (iVar1 == 0) {
      bVar4 = this->_currdata == '_';
    }
  } while (bVar4);
  local_1b = '\0';
  sqvector<char>::push_back(&this->_longstr,&local_1b);
  pcVar2 = sqvector<char>::operator[](&this->_longstr,0);
  SVar3 = sqvector<char>::size(&this->_longstr);
  local_18 = GetIDType(this,pcVar2,SVar3 - 1);
  if ((local_18 == 0x102) || (local_18 == 0x136)) {
    pcVar2 = sqvector<char>::operator[](&this->_longstr,0);
    this->_svalue = pcVar2;
  }
  return local_18;
}

Assistant:

SQInteger SQLexer::ReadID()
{
    SQInteger res;
    INIT_TEMP_STRING();
    do {
        APPEND_CHAR(CUR_CHAR);
        NEXT();
    } while(scisalnum(CUR_CHAR) || CUR_CHAR == _SC('_'));
    TERMINATE_BUFFER();
    res = GetIDType(&_longstr[0],_longstr.size() - 1);
    if(res == TK_IDENTIFIER || res == TK_CONSTRUCTOR) {
        _svalue = &_longstr[0];
    }
    return res;
}